

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void SHA1Update(SHA1_CTX *context,uchar *data,uint32_t len)

{
  uint uVar1;
  uint uVar2;
  uint local_24;
  uint local_20;
  uint32_t j;
  uint32_t i;
  uint32_t len_local;
  uchar *data_local;
  SHA1_CTX *context_local;
  
  uVar1 = context->count[0];
  uVar2 = len * 8 + context->count[0];
  context->count[0] = uVar2;
  if (uVar2 < uVar1) {
    context->count[1] = context->count[1] + 1;
  }
  context->count[1] = (len >> 0x1d) + context->count[1];
  local_24 = uVar1 >> 3 & 0x3f;
  if (local_24 + len < 0x40) {
    local_20 = 0;
  }
  else {
    local_20 = 0x40 - local_24;
    memcpy(context->buffer + local_24,data,(ulong)local_20);
    SHA1Transform(context->state,context->buffer);
    for (; local_20 + 0x3f < len; local_20 = local_20 + 0x40) {
      SHA1Transform(context->state,data + local_20);
    }
    local_24 = 0;
  }
  memcpy(context->buffer + local_24,data + local_20,(ulong)(len - local_20));
  return;
}

Assistant:

static void SHA1Update(SHA1_CTX *context, const unsigned char *data,
                       uint32_t len) {
  uint32_t i, j;

  j = context->count[0];
  if ((context->count[0] += len << 3) < j)
    context->count[1]++;
  context->count[1] += (len>>29);
  j = (j >> 3) & 63;
  if ((j + len) > 63) {
    memcpy(&context->buffer[j], data, (i = 64-j));
    SHA1Transform(context->state, context->buffer);
    for ( ; i + 63 < len; i += 64) {
      SHA1Transform(context->state, &data[i]);
    }
    j = 0;
  }
  else i = 0;
  memcpy(&context->buffer[j], &data[i], len - i);
}